

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# survey.c
# Opt level: O0

void surv0_ctx_recv(void *arg,nni_aio *aio)

{
  _Bool _Var1;
  nng_duration nVar2;
  int iVar3;
  nni_time nVar4;
  nni_duration timeout;
  nni_time now;
  nni_msg *msg;
  surv0_sock *sock;
  surv0_ctx *ctx;
  nni_aio *aio_local;
  void *arg_local;
  
  msg = *arg;
  sock = (surv0_sock *)arg;
  ctx = (surv0_ctx *)aio;
  aio_local = (nni_aio *)arg;
  nVar4 = nni_clock();
  nni_mtx_lock((nni_mtx *)(msg->m_header_buf + 8));
  if ((*(int *)&(sock->pipes).ll_head.ln_next == 0) || ((sock->ctx).recv_lmq.lmq_get <= nVar4)) {
    nni_mtx_unlock((nni_mtx *)(msg->m_header_buf + 8));
    nni_aio_finish_error((nni_aio *)ctx,NNG_ESTATE);
  }
  else {
    nVar2 = nni_aio_get_timeout((nni_aio *)ctx);
    if ((nVar2 < 1) || ((sock->ctx).recv_lmq.lmq_get < nVar4 + (long)nVar2)) {
      nni_aio_set_expire((nni_aio *)ctx,(sock->ctx).recv_lmq.lmq_get);
    }
    while (iVar3 = nni_lmq_get((nni_lmq *)&(sock->pipes).ll_head.ln_prev,(nng_msg **)&now),
          iVar3 == 0) {
      _Var1 = nni_lmq_empty((nni_lmq *)&(sock->pipes).ll_head.ln_prev);
      if ((_Var1) && (sock == (surv0_sock *)&msg->m_body)) {
        nni_pollable_clear((nni_pollable *)(msg[1].m_header_buf + 8));
      }
      now = (nni_time)nni_msg_unique((nni_msg *)now);
      if ((nni_msg *)now != (nni_msg *)0x0) {
        nni_mtx_unlock((nni_mtx *)(msg->m_header_buf + 8));
        nni_aio_finish_msg((nni_aio *)ctx,(nni_msg *)now);
        return;
      }
      now = 0;
    }
    _Var1 = nni_aio_start((nni_aio *)ctx,surv0_ctx_cancel,sock);
    if (_Var1) {
      nni_list_append((nni_list *)&(sock->ctx).recv_lmq,ctx);
      nni_mtx_unlock((nni_mtx *)(msg->m_header_buf + 8));
    }
    else {
      nni_mtx_unlock((nni_mtx *)(msg->m_header_buf + 8));
    }
  }
  return;
}

Assistant:

static void
surv0_ctx_recv(void *arg, nni_aio *aio)
{
	surv0_ctx   *ctx  = arg;
	surv0_sock  *sock = ctx->sock;
	nni_msg     *msg;
	nni_time     now;
	nni_duration timeout;

	now = nni_clock();

	nni_mtx_lock(&sock->mtx);
	if ((ctx->survey_id == 0) || (now >= ctx->expire)) {
		nni_mtx_unlock(&sock->mtx);
		nni_aio_finish_error(aio, NNG_ESTATE);
		return;
	}

	timeout = nni_aio_get_timeout(aio);
	if ((timeout < 1) || ((now + timeout) > ctx->expire)) {
		// limit the timeout to the survey time
		nni_aio_set_expire(aio, ctx->expire);
	}

again:
	if (nni_lmq_get(&ctx->recv_lmq, &msg) != 0) {
		if (!nni_aio_start(aio, &surv0_ctx_cancel, ctx)) {
			nni_mtx_unlock(&sock->mtx);
			return;
		}
		nni_list_append(&ctx->recv_queue, aio);
		nni_mtx_unlock(&sock->mtx);
		return;
	}
	if (nni_lmq_empty(&ctx->recv_lmq) && (ctx == &sock->ctx)) {
		nni_pollable_clear(&sock->readable);
	}
	if ((msg = nni_msg_unique(msg)) == NULL) {
		goto again;
	}

	nni_mtx_unlock(&sock->mtx);
	nni_aio_finish_msg(aio, msg);
}